

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O1

int plat_walker(char *name,void *arg)

{
  uint uVar1;
  
  uVar1 = (**arg)(name,*(undefined8 *)((long)arg + 8));
  if (3 < uVar1) {
    uVar1 = 1;
  }
  return uVar1;
}

Assistant:

static int
plat_walker(const char *name, void *arg)
{
	struct walkdata *w = arg;
	int              rv;

	rv = w->fn(name, w->arg);
	switch (rv) {
	case NNI_FILE_WALK_CONTINUE:
		return (NNI_PLAT_FILE_WALK_CONTINUE);
	case NNI_FILE_WALK_STOP:
		return (NNI_PLAT_FILE_WALK_STOP);
	case NNI_FILE_WALK_PRUNE_CHILD:
		return (NNI_PLAT_FILE_WALK_PRUNE_CHILD);
	case NNI_FILE_WALK_PRUNE_SIB:
		return (NNI_PLAT_FILE_WALK_PRUNE_SIB);
	}
	// We treat any other value as a stop condition.  The program
	// is returning something invalid.
	return (NNI_PLAT_FILE_WALK_STOP);
}